

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::ListFlattenStats(ClientContext *context,FunctionStatisticsInput *input)

{
  reference pvVar1;
  long in_RDX;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> in_RDI;
  BaseStatistics child_copy;
  BaseStatistics *list_child_stats;
  vector<duckdb::BaseStatistics,_true> *child_stats;
  BaseStatistics local_80 [88];
  undefined8 local_28;
  undefined8 local_20;
  
  local_20 = *(undefined8 *)(in_RDX + 0x10);
  pvVar1 = vector<duckdb::BaseStatistics,_true>::operator[]
                     ((vector<duckdb::BaseStatistics,_true> *)in_RDI._M_head_impl,
                      (size_type)in_RDI._M_head_impl);
  local_28 = duckdb::ListStats::GetChildStats(pvVar1);
  duckdb::BaseStatistics::Copy();
  duckdb::BaseStatistics::Set((StatsInfo)local_80);
  duckdb::BaseStatistics::ToUnique();
  duckdb::BaseStatistics::~BaseStatistics(local_80);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> ListFlattenStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &list_child_stats = ListStats::GetChildStats(child_stats[0]);
	auto child_copy = list_child_stats.Copy();
	child_copy.Set(StatsInfo::CAN_HAVE_NULL_VALUES);
	return child_copy.ToUnique();
}